

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O3

ReturnCode scanstring(Global *global,int delim,_func_ReturnCode_Global_ptr_int *outfun)

{
  ReturnCode RVar1;
  int iVar2;
  
  global->instring = 1;
  RVar1 = (*outfun)(global,delim);
  if (RVar1 != FPP_OK) {
    return RVar1;
  }
  iVar2 = get(global);
  do {
    if (iVar2 == delim) {
      global->instring = 0;
LAB_00106702:
      RVar1 = (*outfun)(global,delim);
      return RVar1;
    }
    if ((iVar2 == 0) || (iVar2 == 10)) {
      global->instring = 0;
      if (iVar2 != delim) {
        cerror(global,ERROR_UNTERMINATED_STRING);
        unget(global);
        return FPP_UNTERMINATED_STRING;
      }
      goto LAB_00106702;
    }
    RVar1 = (*outfun)(global,iVar2);
    if (RVar1 != FPP_OK) {
      return RVar1;
    }
    if (iVar2 == 0x5c) {
      iVar2 = get(global);
      RVar1 = (*outfun)(global,iVar2);
      if (RVar1 != FPP_OK) {
        return RVar1;
      }
    }
    iVar2 = get(global);
  } while( true );
}

Assistant:

ReturnCode scanstring(struct Global *global,
		      int delim, /* ' or " */
		      /* Output function: */
		      ReturnCode (*outfun)(struct Global *, int))
{
  /*
   * Scan off a string.  Warning if terminated by newline or EOF.
   * outfun() outputs the character -- to a buffer if in a macro.
   * TRUE if ok, FALSE if error.
   */

  int c;
  ReturnCode ret;
  
  global->instring = TRUE;		/* Don't strip comments         */
  ret=(*outfun)(global, delim);
  if(ret)
    return(ret);
  while ((c = get(global)) != delim
	 && c != '\n'
	 && c != EOF_CHAR) {
    ret=(*outfun)(global, c);
    if(ret)
      return(ret);
    if (c == '\\') {
      ret=(*outfun)(global, get(global));
      if(ret)
	return(ret);
    }
  }
  global->instring = FALSE;
  if (c == delim) {
    ret=(*outfun)(global, c);
    return(ret);
  } else {
    cerror(global, ERROR_UNTERMINATED_STRING);
    unget(global);
    return(FPP_UNTERMINATED_STRING);
  }
}